

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

void __thiscall
Future<void>::Private::ThreadPool::run(ThreadPool *this,_func_void_void_ptr *proc,void *args)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint64 uVar4;
  long lVar5;
  int64 iVar6;
  Iterator *pIVar7;
  ThreadContext *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Job *data;
  Iterator local_c8;
  Iterator end_1;
  Iterator i_1;
  Job job_1;
  Guard local_a0;
  Guard guard_1;
  Iterator local_70;
  Iterator end;
  Iterator i;
  Guard guard;
  ThreadContext *context;
  ssize idleThreads;
  usize threadCount;
  ssize busyThreads;
  usize pushedJobs;
  Job job;
  void *args_local;
  _func_void_void_ptr *proc_local;
  ThreadPool *this_local;
  
  pushedJobs = (usize)proc;
  job.proc = (_func_void_void_ptr *)args;
  job.args = args;
  while (bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push
                           (&this->_queue,(Job *)&pushedJobs), ((bVar2 ^ 0xffU) & 1) != 0) {
    FastSignal::reset(&this->_dequeuedSignal);
    data = (Job *)&pushedJobs;
    bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(&this->_queue,data);
    if (bVar2) break;
    FastSignal::wait(&this->_dequeuedSignal,data);
  }
  FastSignal::set(&this->_enqueuedSignal);
  uVar4 = Atomic::increment(&this->_pushedJobs);
  uVar1 = this->_threadCount;
  lVar5 = uVar1 - (uVar4 - this->_processedJobs);
  if (lVar5 == 1) {
    iVar6 = Time::ticks();
    this->_idleResetTime = (uint32)(iVar6 >> 10);
  }
  else if (lVar5 < 1) {
    iVar6 = Time::ticks();
    this->_idleResetTime = (uint32)(iVar6 >> 10);
    if (uVar1 < this->_maxThreads) {
      guard._mutex = (Mutex *)0x0;
      Mutex::Guard::Guard((Guard *)&i,&this->_mutex);
      pIVar7 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::begin(&this->_threads);
      end.item = pIVar7->item;
      pIVar7 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::end(&this->_threads);
      local_70.item = pIVar7->item;
      while (bVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::
                     operator!=(&end,&local_70), bVar2) {
        pTVar8 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator->
                           (&end);
        if ((pTVar8->_terminated & 1U) == 0) {
          PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator++(&end);
        }
        else {
          iVar3 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                            (&this->_threads,(char *)&end);
          end.item = (Item *)CONCAT44(extraout_var,iVar3);
        }
      }
      if (this->_threadCount < this->_maxThreads) {
        this->_threadCount = this->_threadCount + 1;
        guard._mutex = (Mutex *)PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append
                                          (&this->_threads);
      }
      Mutex::Guard::~Guard((Guard *)&i);
      if (guard._mutex != (Mutex *)0x0) {
        guard._mutex[1].data[0] = (int64)this;
        guard_1._mutex = (Mutex *)ThreadContext::proc;
        bVar2 = Thread::start<Future<void>::Private::ThreadPool::ThreadContext>
                          ((Thread *)guard._mutex,(ThreadContext *)guard._mutex,0x119eb0);
        if (!bVar2) {
          *(undefined1 *)((guard._mutex)->data + 4) = 1;
        }
      }
    }
  }
  else if (((1 < lVar5) && (this->_minThreads < uVar1)) &&
          (iVar6 = Time::ticks(), 1 < (int)(iVar6 >> 10) - this->_idleResetTime)) {
    Mutex::Guard::Guard(&local_a0,&this->_mutex);
    if (this->_minThreads < this->_threadCount) {
      i_1.item = (Item *)0x0;
      bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(&this->_queue,(Job *)&i_1)
      ;
      if (bVar2) {
        this->_threadCount = this->_threadCount - 1;
      }
    }
    pIVar7 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::begin(&this->_threads);
    end_1.item = pIVar7->item;
    pIVar7 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::end(&this->_threads);
    local_c8.item = pIVar7->item;
    while (bVar2 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator!=
                             (&end_1,&local_c8), bVar2) {
      pTVar8 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator->
                         (&end_1);
      if ((pTVar8->_terminated & 1U) == 0) {
        PoolList<Future<void>::Private::ThreadPool::ThreadContext>::Iterator::operator++(&end_1);
      }
      else {
        iVar3 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                          (&this->_threads,(char *)&end_1);
        end_1.item = (Item *)CONCAT44(extraout_var_00,iVar3);
      }
    }
    Mutex::Guard::~Guard(&local_a0);
  }
  return;
}

Assistant:

void run(void (*proc)(void *), void *args)
    {
      Job job = {proc, args};
      while (!_queue.push(job))
      {
        _dequeuedSignal.reset();
        if (_queue.push(job))
          break;
        _dequeuedSignal.wait();
      }
      _enqueuedSignal.set();

      // adjust worker thread count
      usize pushedJobs = Atomic::increment(_pushedJobs);
      ssize busyThreads = (ssize)(pushedJobs - _processedJobs);
      usize threadCount = _threadCount;
      ssize idleThreads = (ssize)threadCount - busyThreads;
      if (idleThreads == 1)
        _idleResetTime = (uint32)(Time::ticks() >> 10);
      else
      {
        if (idleThreads <= 0)
        { // start new worker thread
          _idleResetTime = (uint32)(Time::ticks() >> 10);
          if (threadCount < _maxThreads)
          {
            ThreadContext *context = 0;
            {
              Mutex::Guard guard(_mutex);
              for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
              {
                if (i->_terminated)
                  i = _threads.remove(i);
                else
                  ++i;
              }
              if (_threadCount < _maxThreads)
              {
                ++_threadCount;
                context = &_threads.append();
              }
            }
            if (context)
            {
              context->_pool = this;
              if (!context->_thread.start(*context, &ThreadContext::proc))
                context->_terminated = true;
            }
          }
        }
        else if (idleThreads > 1 && threadCount > _minThreads && (uint32)(Time::ticks() >> 10) - _idleResetTime > 1)
        { // terminate a worker thread
          Mutex::Guard guard(_mutex);
          if (_threadCount > _minThreads)
          {
            Job job = {0, 0};
            if (_queue.push(job))
              --_threadCount;
          }
          for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
          {
            if (i->_terminated)
              i = _threads.remove(i);
            else
              ++i;
          }
        }
      }
    }